

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O1

idx_t duckdb::VectorStringToList::CountPartsList(string_t *input)

{
  char *pcVar1;
  idx_t *piVar2;
  idx_t *piVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  idx_t iVar11;
  idx_t pos;
  optional_idx start_pos;
  idx_t len;
  idx_t end_pos;
  ulong local_70;
  StringCastInputState local_68;
  optional_idx local_48;
  ulong local_40;
  idx_t local_38;
  
  local_40 = (ulong)(input->value).pointer.length;
  if (local_40 < 0xd) {
    pcVar9 = (input->value).pointer.prefix;
  }
  else {
    pcVar9 = (input->value).pointer.ptr;
  }
  local_68.len = &local_40;
  local_68.pos = &local_70;
  local_70 = 0;
  if (local_40 != 0) {
    uVar8 = 1;
    do {
      uVar7 = uVar8;
      if ((4 < (byte)pcVar9[uVar7 - 1] - 9) && (pcVar9[uVar7 - 1] != 0x20)) break;
      uVar8 = uVar7 + 1;
      local_70 = uVar7;
    } while (uVar7 != local_40);
  }
  if ((local_70 == local_40) || (pcVar9[local_70] != '[')) {
    return 0;
  }
  uVar8 = local_70 + 1;
  if (uVar8 < local_40) {
    uVar7 = local_70 + 2;
    local_70 = uVar8;
    do {
      uVar6 = uVar7;
      if ((4 < (byte)pcVar9[uVar6 - 1] - 9) && (uVar8 = local_70, pcVar9[uVar6 - 1] != 0x20)) break;
      uVar7 = uVar6 + 1;
      local_70 = uVar6;
      uVar8 = uVar6;
    } while (uVar6 != local_40);
  }
  local_70 = uVar8;
  local_68.escaped = false;
  iVar11 = 0;
  bVar10 = false;
  local_68.buf = pcVar9;
LAB_012e1d44:
  if (local_70 < local_40) {
    local_48.index = 0xffffffffffffffff;
    do {
      if (((local_40 <= local_70) || (pcVar9[local_70] == ',')) || (pcVar9[local_70] == ']')) {
        iVar5 = 1;
        if (local_70 == local_40) goto LAB_012e1e35;
        if ((local_48.index != 0xffffffffffffffff || pcVar9[local_70] != ']') || (bVar10)) {
          if (local_48.index != 0xffffffffffffffff) {
            optional_idx::GetIndex(&local_48);
          }
          iVar11 = iVar11 + 1;
          bVar10 = true;
        }
        piVar3 = local_68.len;
        piVar2 = local_68.pos;
        pcVar1 = local_68.buf;
        iVar5 = 3;
        if (pcVar9[local_70] == ']') goto LAB_012e1e35;
        local_70 = local_70 + 1;
        uVar8 = *local_68.pos;
        iVar5 = 0;
        if (*local_68.len <= uVar8) goto LAB_012e1e35;
        goto LAB_012e1e0b;
      }
      bVar4 = ValueStateTransition(&local_68,&local_48,&local_38);
    } while (bVar4);
    iVar5 = 1;
    goto LAB_012e1e35;
  }
  goto LAB_012e1e42;
  while( true ) {
    uVar8 = uVar8 + 1;
    *piVar2 = uVar8;
    local_68.escaped = false;
    if (*piVar3 <= uVar8) break;
LAB_012e1e0b:
    if ((4 < (byte)pcVar1[uVar8] - 9) && (pcVar1[uVar8] != 0x20)) break;
  }
LAB_012e1e35:
  if (iVar5 != 0) {
    if (iVar5 == 3) {
LAB_012e1e42:
      uVar8 = *local_68.pos;
      if (uVar8 < *local_68.len) {
        do {
          if ((4 < (byte)local_68.buf[uVar8] - 9) && (local_68.buf[uVar8] != 0x20)) {
            return iVar11;
          }
          uVar8 = uVar8 + 1;
          *local_68.pos = uVar8;
        } while (uVar8 < *local_68.len);
      }
    }
    return iVar11;
  }
  goto LAB_012e1d44;
}

Assistant:

idx_t VectorStringToList::CountPartsList(const string_t &input) {
	CountPartOperation state;
	SplitStringListInternal<CountPartOperation>(input, state);
	return state.count;
}